

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlCopyNamespaceList(xmlNsPtr cur)

{
  xmlNsPtr pxVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr q;
  xmlNsPtr p;
  xmlNsPtr ret;
  xmlNsPtr cur_local;
  
  p = (xmlNsPtr)0x0;
  q = (xmlNsPtr)0x0;
  ret = cur;
  while( true ) {
    if (ret == (xmlNsPtr)0x0) {
      return p;
    }
    pxVar2 = xmlCopyNamespace(ret);
    if (pxVar2 == (xmlNsPtr)0x0) break;
    pxVar1 = pxVar2;
    if (q != (xmlNsPtr)0x0) {
      q->next = pxVar2;
      pxVar1 = p;
    }
    p = pxVar1;
    ret = ret->next;
    q = pxVar2;
  }
  xmlFreeNsList(p);
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlCopyNamespaceList(xmlNsPtr cur) {
    xmlNsPtr ret = NULL;
    xmlNsPtr p = NULL,q;

    while (cur != NULL) {
        q = xmlCopyNamespace(cur);
        if (q == NULL) {
            xmlFreeNsList(ret);
            return(NULL);
        }
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}